

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

bool Js::DynamicProfileInfo::IsEnabled(Phase phase,FunctionBody *functionBody)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  ScriptContext *scriptContext;
  
  if (functionBody == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x10d,"(functionBody)","functionBody");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  bVar2 = IsEnabled_OptionalFunctionBody(phase,functionBody,scriptContext);
  if (bVar2) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_01453738,WasmInOutPhase);
    bVar2 = true;
    if (bVar3) {
      bVar2 = ((functionBody->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) == 0;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DynamicProfileInfo::IsEnabled(const Js::Phase phase, const FunctionBody *const functionBody)
    {
        Assert(functionBody);
        return (IsEnabled_OptionalFunctionBody(phase, functionBody, functionBody->GetScriptContext())
#ifdef ENABLE_WASM
            && !(PHASE_TRACE1(Js::WasmInOutPhase) && functionBody->IsWasmFunction())
#endif
            );
    }